

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O2

void __thiscall glTF::Material::Material(Material *this)

{
  (this->super_Object).id._M_dataplus._M_p = (pointer)&(this->super_Object).id.field_2;
  (this->super_Object).id._M_string_length = 0;
  (this->super_Object).id.field_2._M_local_buf[0] = '\0';
  (this->super_Object).name._M_dataplus._M_p = (pointer)&(this->super_Object).name.field_2;
  (this->super_Object).name._M_string_length = 0;
  (this->super_Object).name.field_2._M_local_buf[0] = '\0';
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_00759148;
  (this->ambient).texture.vector = (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0;
  (this->ambient).texture.index = 0;
  (this->diffuse).texture.vector = (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0;
  (this->diffuse).texture.index = 0;
  (this->specular).texture.vector = (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0
  ;
  (this->specular).texture.index = 0;
  (this->emission).texture.vector = (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0
  ;
  (this->emission).texture.index = 0;
  SetDefaults(this);
  return;
}

Assistant:

Material() { SetDefaults(); }